

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Encode(Minefield_Query_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pPVar3;
  reference puVar4;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_38;
  const_iterator citrEndSt;
  const_iterator citrSt;
  const_iterator citrEndPnt;
  const_iterator citrPnt;
  KDataStream *stream_local;
  Minefield_Query_PDU *this_local;
  
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_ReqID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ReqID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumPerimPoints);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8Padding1);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumSensTyp);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_DataFilter).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_MineTypFilter).super_DataTypeBase);
  citrEndPnt = std::
               vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
               ::begin(&this->m_vPoints);
  citrSt._M_current =
       (unsigned_short *)
       std::
       vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
       ::end(&this->m_vPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&citrEndPnt,
                       (__normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
                        *)&citrSt);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
             ::operator->(&citrEndPnt);
    (*(pPVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pPVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
    ::operator++(&citrEndPnt);
  }
  citrEndSt = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                        (&this->m_vui16SensorTypes);
  local_38._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->m_vui16SensorTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEndSt,&local_38);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrEndSt);
    KDataStream::operator<<(stream,*puVar4);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrEndSt);
  }
  if ((this->m_bNeedsPadding & 1U) != 0) {
    KDataStream::operator<<(stream,this->m_ui16Padding1);
  }
  return;
}

Assistant:

void Minefield_Query_PDU::Encode( KDataStream & stream ) const
{
    Minefield_Header::Encode( stream );

    stream << KDIS_STREAM m_ReqID
           << m_ui8ReqID
           << m_ui8NumPerimPoints
           << m_ui8Padding1
           << m_ui8NumSensTyp
           << KDIS_STREAM m_DataFilter
           << KDIS_STREAM m_MineTypFilter;

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        citrPnt->Encode( stream );
    }

    std::vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    std::vector<KUINT16>::const_iterator citrEndSt = m_vui16SensorTypes.end();
    for( ; citrSt != citrEndSt; ++citrSt )
    {
        stream << *citrSt;
    }

    if( m_bNeedsPadding )
    {
        stream << m_ui16Padding1;
    }
}